

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

void Model<Slot>::readFromFile(string *filename)

{
  long *plVar1;
  fstream file;
  Slot object;
  pair<int,_Slot> local_9a0;
  
  std::fstream::fstream((string *)&file);
  std::fstream::open((string *)&file,(_Ios_Openmode)filename);
  Slot::Slot(&object);
  while( true ) {
    plVar1 = (long *)std::istream::read((char *)&file,(long)&object);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    std::pair<int,_Slot>::pair<int_&,_Slot_&,_true>(&local_9a0,&object.super_Model<Slot>.id,&object)
    ;
    std::
    _Rb_tree<int,std::pair<int_const,Slot>,std::_Select1st<std::pair<int_const,Slot>>,std::less<int>,std::allocator<std::pair<int_const,Slot>>>
    ::_M_emplace_unique<std::pair<int,Slot>>
              ((_Rb_tree<int,std::pair<int_const,Slot>,std::_Select1st<std::pair<int_const,Slot>>,std::less<int>,std::allocator<std::pair<int_const,Slot>>>
                *)&objectList,&local_9a0);
  }
  std::fstream::close();
  std::fstream::~fstream(&file);
  return;
}

Assistant:

void Model<T>::readFromFile(const string &filename) {
    fstream file;
    file.open(filename, ios::in | ios::out | ios::binary);
    T object;
    while (file.read((char *) &object, sizeof(object))) {
        Model<T>::objectList.insert(pair<int, T>(object.id, object));
    }
    file.close();
}